

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_defun.hpp
# Opt level: O0

SQInteger squall::detail::stub<1,std::function<void(Foo*,int)>>(HSQUIRRELVM vm)

{
  SQUserPointer vm_00;
  int iVar1;
  SQRESULT SVar2;
  SQUserPointer *in_stack_fffffffffffffee0;
  SQUserPointer *in_stack_fffffffffffffee8;
  SQInteger in_stack_fffffffffffffef0;
  HSQUIRRELVM in_stack_fffffffffffffef8;
  exception *e;
  SQInteger x;
  function<void_(Foo_*,_int)> *f;
  undefined8 *local_20;
  SQUserPointer fp;
  HSQUIRRELVM vm_local;
  
  fp = vm;
  SVar2 = sq_getuserdata(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                         in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  vm_00 = fp;
  if (SVar2 < 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/KatuH[P]squall/samples/../squall/squall_defun.hpp"
                  ,0x42,
                  "SQInteger squall::detail::stub(HSQUIRRELVM) [Offset = 1, F = std::function<void (Foo *, int)>]"
                 );
  }
  x = *local_20;
  std::function<void_(Foo_*,_int)>::function
            ((function<void_(Foo_*,_int)> *)&e,(function<void_(Foo_*,_int)> *)x);
  iVar1 = Stub<void(Foo*,int)>::doit<std::function<void(Foo*,int)>>
                    ((HSQUIRRELVM)vm_00,1,(function<void_(Foo_*,_int)> *)&e);
  std::function<void_(Foo_*,_int)>::~function((function<void_(Foo_*,_int)> *)&e);
  return (long)iVar1;
}

Assistant:

SQInteger stub(HSQUIRRELVM vm) {
    try {
        SQUserPointer fp;
        if(!SQ_SUCCEEDED(sq_getuserdata(vm, -1, &fp, NULL))) { assert(0); }
        const F& f = **((F**)fp);

        SQInteger x = Stub<typename detail::function_traits<F>::type>::doit(
            vm, Offset, f);
        return x;
    }
    catch(std::exception& e) {
        return sq_throwerror(
            vm, (string(_SC("error in callback: ")) + locale_converter::to_squall_string(e.what()).c_str()).c_str());
    }
}